

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactTuple.h
# Opt level: O1

void __thiscall
chrono::ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
::ChContactTuple(ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                 *this,ChContactContainer *mcontainer,ChContactable_3vars<6,_6,_6> *mobjA,
                ChContactable_3vars<6,_6,_6> *mobjB,ChCollisionInfo *cinfo)

{
  this->_vptr_ChContactTuple = (_func_int **)&PTR__ChContactTuple_00b3c8b8;
  (this->p1).m_data[0] = 0.0;
  (this->p1).m_data[1] = 0.0;
  (this->p1).m_data[2] = 0.0;
  (this->p2).m_data[0] = 0.0;
  (this->p2).m_data[1] = 0.0;
  (this->p2).m_data[2] = 0.0;
  (this->normal).m_data[0] = 0.0;
  (this->normal).m_data[1] = 0.0;
  (this->normal).m_data[2] = 0.0;
  if (mcontainer == (ChContactContainer *)0x0) {
    __assert_fail("mcontainer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                  ,0x3e,
                  "chrono::ChContactTuple<chrono::ChContactable_3vars<6, 6, 6>, chrono::ChContactable_3vars<6, 6, 6>>::ChContactTuple(ChContactContainer *, Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_3vars<6, 6, 6>, Tb = chrono::ChContactable_3vars<6, 6, 6>]"
                 );
  }
  if (mobjA != (ChContactable_3vars<6,_6,_6> *)0x0) {
    if (mobjB != (ChContactable_3vars<6,_6,_6> *)0x0) {
      this->container = mcontainer;
      return;
    }
    __assert_fail("mobjB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                  ,0x40,
                  "chrono::ChContactTuple<chrono::ChContactable_3vars<6, 6, 6>, chrono::ChContactable_3vars<6, 6, 6>>::ChContactTuple(ChContactContainer *, Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_3vars<6, 6, 6>, Tb = chrono::ChContactable_3vars<6, 6, 6>]"
                 );
  }
  __assert_fail("mobjA",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                ,0x3f,
                "chrono::ChContactTuple<chrono::ChContactable_3vars<6, 6, 6>, chrono::ChContactable_3vars<6, 6, 6>>::ChContactTuple(ChContactContainer *, Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_3vars<6, 6, 6>, Tb = chrono::ChContactable_3vars<6, 6, 6>]"
               );
}

Assistant:

ChContactTuple(ChContactContainer* mcontainer,          ///< contact container
                   Ta* mobjA,                               ///< ChContactable object A
                   Tb* mobjB,                               ///< ChContactable object B
                   const collision::ChCollisionInfo& cinfo  ///< data for the contact pair
    ) {
        assert(mcontainer);
        assert(mobjA);
        assert(mobjB);

        container = mcontainer;
    }